

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicAllFormatsStoreCS::Run(BasicAllFormatsStoreCS *this)

{
  bool bVar1;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Vector<unsigned_int,_4> local_178;
  Vector<unsigned_int,_4> local_168;
  Vector<unsigned_int,_4> local_158;
  Vector<unsigned_int,_4> local_148;
  Vector<unsigned_int,_4> local_138;
  Vector<unsigned_int,_4> local_128;
  Vector<unsigned_int,_4> local_118;
  Vector<unsigned_int,_4> local_108;
  Vector<int,_4> local_f8;
  Vector<int,_4> local_e8;
  Vector<int,_4> local_d8;
  Vector<int,_4> local_c8;
  Vector<int,_4> local_b8;
  Vector<int,_4> local_a8;
  Vector<int,_4> local_98;
  Vector<int,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  BasicAllFormatsStoreCS *local_18;
  BasicAllFormatsStoreCS *this_local;
  
  local_18 = this;
  tcu::Vector<float,_4>::Vector(&local_28,1.0,2.0,3.0,4.0);
  tcu::Vector<float,_4>::Vector(&local_38,1.0,2.0,3.0,4.0);
  bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::WriteCS<tcu::Vector<float,4>>
                    ((BasicAllFormatsStoreCS *)this,0x8814,&local_28,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<float,_4>::Vector(&local_48,1.0,2.0,3.0,4.0);
    tcu::Vector<float,_4>::Vector(&local_58,1.0,0.0,0.0,1.0);
    bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::WriteCS<tcu::Vector<float,4>>
                      ((BasicAllFormatsStoreCS *)this,0x822e,&local_48,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<float,_4>::Vector(&local_68,1.0,2.0,3.0,4.0);
      tcu::Vector<float,_4>::Vector(&local_78,1.0,2.0,3.0,4.0);
      bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::WriteCS<tcu::Vector<float,4>>
                        ((BasicAllFormatsStoreCS *)this,0x881a,&local_68,&local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<int,_4>::Vector(&local_88,1,-2,3,-4);
        tcu::Vector<int,_4>::Vector(&local_98,1,-2,3,-4);
        bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::WriteCS<tcu::Vector<int,4>>
                          ((BasicAllFormatsStoreCS *)this,0x8d82,&local_88,&local_98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<int,_4>::Vector(&local_a8,1,-2,3,-4);
          tcu::Vector<int,_4>::Vector(&local_b8,1,0,0,1);
          bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::WriteCS<tcu::Vector<int,4>>
                            ((BasicAllFormatsStoreCS *)this,0x8235,&local_a8,&local_b8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<int,_4>::Vector(&local_c8,1,-2,3,-4);
            tcu::Vector<int,_4>::Vector(&local_d8,1,-2,3,-4);
            bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                    WriteCS<tcu::Vector<int,4>>
                              ((BasicAllFormatsStoreCS *)this,0x8d88,&local_c8,&local_d8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              tcu::Vector<int,_4>::Vector(&local_e8,1,-2,3,-4);
              tcu::Vector<int,_4>::Vector(&local_f8,1,-2,3,-4);
              bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                      WriteCS<tcu::Vector<int,4>>
                                ((BasicAllFormatsStoreCS *)this,0x8d8e,&local_e8,&local_f8);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                tcu::Vector<unsigned_int,_4>::Vector(&local_108,0,1,2,3);
                tcu::Vector<unsigned_int,_4>::Vector(&local_118,0,1,2,3);
                bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                        WriteCS<tcu::Vector<unsigned_int,4>>
                                  ((BasicAllFormatsStoreCS *)this,0x8d70,&local_108,&local_118);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  tcu::Vector<unsigned_int,_4>::Vector(&local_128,7,2,3,4);
                  tcu::Vector<unsigned_int,_4>::Vector(&local_138,7,0,0,1);
                  bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                          WriteCS<tcu::Vector<unsigned_int,4>>
                                    ((BasicAllFormatsStoreCS *)this,0x8236,&local_128,&local_138);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    tcu::Vector<unsigned_int,_4>::Vector(&local_148,0,1,2,3);
                    tcu::Vector<unsigned_int,_4>::Vector(&local_158,0,1,2,3);
                    bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                            WriteCS<tcu::Vector<unsigned_int,4>>
                                      ((BasicAllFormatsStoreCS *)this,0x8d76,&local_148,&local_158);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      tcu::Vector<unsigned_int,_4>::Vector(&local_168,0,1,2,3);
                      tcu::Vector<unsigned_int,_4>::Vector(&local_178,0,1,2,3);
                      bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                              WriteCS<tcu::Vector<unsigned_int,4>>
                                        ((BasicAllFormatsStoreCS *)this,0x8d7c,&local_168,&local_178
                                        );
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        tcu::Vector<float,_4>::Vector(&local_188,1.0);
                        tcu::Vector<float,_4>::Vector(&local_198,1.0);
                        bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                                WriteCS<tcu::Vector<float,4>>
                                          ((BasicAllFormatsStoreCS *)this,0x8058,&local_188,
                                           &local_198);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          tcu::Vector<float,_4>::Vector(&local_1a8,1.0,-1.0,1.0,-1.0);
                          tcu::Vector<float,_4>::Vector(&local_1b8,1.0,-1.0,1.0,-1.0);
                          bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsStoreCS::
                                  WriteCS<tcu::Vector<float,4>>
                                            ((BasicAllFormatsStoreCS *)this,0x8f97,&local_1a8,
                                             &local_1b8);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            this_local = (BasicAllFormatsStoreCS *)0x0;
                          }
                          else {
                            this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAllFormatsStoreCS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		if (!WriteCS(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!WriteCS(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!WriteCS(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;

		if (!WriteCS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!WriteCS(GL_R32I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;
		if (!WriteCS(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!WriteCS(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;

		if (!WriteCS(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!WriteCS(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;
		if (!WriteCS(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!WriteCS(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;

		if (!WriteCS(GL_RGBA8, vec4(1.0f), vec4(1.0f)))
			return ERROR;

		if (!WriteCS(GL_RGBA8_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;

		return NO_ERROR;
	}